

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.c
# Opt level: O0

uint MCRegisterInfo_getSubReg(MCRegisterInfo *RI,uint Reg,uint Idx)

{
  _Bool _Var1;
  uint16_t uVar2;
  ushort *local_38;
  uint16_t *SRI;
  DiffListIterator iter;
  uint Idx_local;
  uint Reg_local;
  MCRegisterInfo *RI_local;
  
  local_38 = RI->SubRegIndices + RI->Desc[Reg].SubRegIndices;
  iter.List._0_4_ = Idx;
  iter.List._4_4_ = Reg;
  DiffListIterator_init
            ((DiffListIterator *)&SRI,(MCPhysReg)Reg,RI->DiffLists + RI->Desc[Reg].SubRegs);
  DiffListIterator_next((DiffListIterator *)&SRI);
  while( true ) {
    _Var1 = DiffListIterator_isValid((DiffListIterator *)&SRI);
    if (!_Var1) {
      return 0;
    }
    if (*local_38 == (uint)iter.List) break;
    DiffListIterator_next((DiffListIterator *)&SRI);
    local_38 = local_38 + 1;
  }
  uVar2 = DiffListIterator_getVal((DiffListIterator *)&SRI);
  return (uint)uVar2;
}

Assistant:

unsigned MCRegisterInfo_getSubReg(MCRegisterInfo *RI, unsigned Reg, unsigned Idx)
{
	DiffListIterator iter;
	uint16_t *SRI = RI->SubRegIndices + RI->Desc[Reg].SubRegIndices;

	DiffListIterator_init(&iter, (MCPhysReg)Reg, RI->DiffLists + RI->Desc[Reg].SubRegs);
	DiffListIterator_next(&iter);

	while(DiffListIterator_isValid(&iter)) {
		if (*SRI == Idx)
			return DiffListIterator_getVal(&iter);
		DiffListIterator_next(&iter);
		++SRI;
	}

	return 0;
}